

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bz2_stream.cpp
# Opt level: O3

void __thiscall minibag::BZ2Stream::stopWrite(BZ2Stream *this)

{
  runtime_error *prVar1;
  uint nbytes_out;
  uint nbytes_in;
  uint local_4c;
  undefined1 *local_48 [2];
  undefined1 local_38 [20];
  uint local_24;
  
  if (this->bzfile_ == (BZFILE *)0x0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"cannot close unopened bzfile","");
    std::runtime_error::runtime_error(prVar1,(string *)local_48);
    *(undefined ***)prVar1 = &PTR__runtime_error_001506d8;
    __cxa_throw(prVar1,&BagException::typeinfo,std::runtime_error::~runtime_error);
  }
  BZ2_bzWriteClose(&this->bzerror_,this->bzfile_,0,&local_24,&local_4c);
  if (this->bzerror_ != -6) {
    Stream::advanceOffset(&this->super_Stream,(ulong)local_4c);
    Stream::setCompressedIn(&this->super_Stream,0);
    return;
  }
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"BZ_IO_ERROR","");
  std::runtime_error::runtime_error(prVar1,(string *)local_48);
  *(undefined ***)prVar1 = &PTR__runtime_error_00150700;
  __cxa_throw(prVar1,&BagIOException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BZ2Stream::stopWrite() {
    if (!bzfile_) {
        throw BagException("cannot close unopened bzfile");
    }

    unsigned int nbytes_in;
    unsigned int nbytes_out;
    BZ2_bzWriteClose(&bzerror_, bzfile_, 0, &nbytes_in, &nbytes_out);

    switch (bzerror_) {
        case BZ_IO_ERROR: throw BagIOException("BZ_IO_ERROR");
    }

    advanceOffset(nbytes_out);
    setCompressedIn(0);
}